

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::small_vector
          (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this,size_t count,double *value,
          allocator<double> *alloc)

{
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *in_RCX;
  allocator<double> *in_RDX;
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *in_RSI;
  double *in_stack_ffffffffffffffd0;
  size_type in_stack_ffffffffffffffd8;
  
  small_vector(in_RSI,in_RDX);
  assign_impl(in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

explicit small_vector(size_t count, const T& value, const Alloc& alloc = Alloc())
        : small_vector(alloc)
    {
        assign_impl(count, value);
    }